

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O0

void add_erosion_words(obj *obj,char *prefix,boolean in_final_dump)

{
  boolean bVar1;
  uint uVar2;
  char *__s;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  char *local_58;
  char *local_50;
  char *local_48;
  boolean iscrys;
  boolean in_final_dump_local;
  char *prefix_local;
  obj *obj_local;
  
  bVar5 = obj->otyp != 0x1a;
  if ((((((*(ushort *)&objects[obj->otyp].field_0x11 >> 4 & 0x1f) == 0xb) ||
        (bVar1 = is_flammable(obj), bVar1 != '\0')) || (bVar1 = is_rottable(obj), bVar1 != '\0')) ||
      (((*(ushort *)&objects[obj->otyp].field_0x11 >> 4 & 0x1f) == 0xd ||
       ((*(ushort *)&objects[obj->otyp].field_0x11 >> 4 & 0x1f) == 0xb)))) || (!bVar5)) {
    if (((*(uint *)&obj->field_0x4a >> 8 & 3) != 0) && (bVar5)) {
      uVar2 = *(uint *)&obj->field_0x4a >> 8 & 3;
      if (uVar2 == 2) {
        strcat(prefix,"very ");
      }
      else if (uVar2 == 3) {
        strcat(prefix,"thoroughly ");
      }
      pcVar3 = "burnt ";
      if ((*(ushort *)&objects[obj->otyp].field_0x11 >> 4 & 0x1f) == 0xb) {
        pcVar3 = "rusty ";
      }
      strcat(prefix,pcVar3);
    }
    if (((*(uint *)&obj->field_0x4a >> 10 & 3) != 0) && (bVar5)) {
      uVar2 = *(uint *)&obj->field_0x4a >> 10 & 3;
      if (uVar2 == 2) {
        strcat(prefix,"very ");
      }
      else if (uVar2 == 3) {
        strcat(prefix,"thoroughly ");
      }
      bVar6 = true;
      if ((*(ushort *)&objects[obj->otyp].field_0x11 >> 4 & 0x1f) != 0xd) {
        bVar6 = (*(ushort *)&objects[obj->otyp].field_0x11 >> 4 & 0x1f) == 0xb;
      }
      pcVar3 = "rotted ";
      if (bVar6) {
        pcVar3 = "corroded ";
      }
      strcat(prefix,pcVar3);
    }
    if (((*(uint *)&obj->field_0x4a >> 0xc & 1) != 0) &&
       ((in_final_dump != '\0' || ((*(uint *)&obj->field_0x4a >> 7 & 1) != 0)))) {
      __s = eos(prefix);
      pcVar3 = "] [";
      if ((*(uint *)&obj->field_0x4a >> 7 & 1) != 0) {
        pcVar3 = "\n\n";
      }
      if (bVar5) {
        if ((*(ushort *)&objects[obj->otyp].field_0x11 >> 4 & 0x1f) == 0xb) {
          local_50 = "rustproof";
        }
        else {
          if (((*(ushort *)&objects[obj->otyp].field_0x11 >> 4 & 0x1f) == 0xd) ||
             ((*(ushort *)&objects[obj->otyp].field_0x11 >> 4 & 0x1f) == 0xb)) {
            local_58 = "corrodeproof";
          }
          else {
            bVar1 = is_flammable(obj);
            local_58 = "";
            if (bVar1 != '\0') {
              local_58 = "fireproof";
            }
          }
          local_50 = local_58;
        }
        local_48 = local_50;
      }
      else {
        local_48 = "fixed";
      }
      pcVar4 = "]";
      if ((*(uint *)&obj->field_0x4a >> 7 & 1) != 0) {
        pcVar4 = "";
      }
      sprintf(__s,"%s%s%s ",pcVar3 + 2,local_48,pcVar4);
    }
  }
  return;
}

Assistant:

static void add_erosion_words(const struct obj *obj, char *prefix,
			      boolean in_final_dump)
{
	boolean iscrys = (obj->otyp == CRYSKNIFE);


	if (!is_damageable(obj) && !iscrys) return;

	/* The only cases where any of these bits do double duty are for
	 * rotted food and diluted potions, which are all not is_damageable().
	 */
	if (obj->oeroded && !iscrys) {
		switch (obj->oeroded) {
			case 2:	strcat(prefix, "very "); break;
			case 3:	strcat(prefix, "thoroughly "); break;
		}			
		strcat(prefix, is_rustprone(obj) ? "rusty " : "burnt ");
	}
	if (obj->oeroded2 && !iscrys) {
		switch (obj->oeroded2) {
			case 2:	strcat(prefix, "very "); break;
			case 3:	strcat(prefix, "thoroughly "); break;
		}			
		strcat(prefix, is_corrodeable(obj) ? "corroded " :
			"rotted ");
	}
	if (obj->oerodeproof && (in_final_dump || obj->rknown))
		sprintf(eos(prefix), "%s%s%s ",
			obj->rknown ? "" : "[",
			iscrys ? "fixed" :
			is_rustprone(obj) ? "rustproof" :
			is_corrodeable(obj) ? "corrodeproof" :	/* "stainless"? */
			is_flammable(obj) ? "fireproof" : "",
			obj->rknown ? "" : "]");
}